

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int print_full_gau(char *fn)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint32 n_density;
  uint32 n_feat;
  uint32 n_mgau;
  uint32 *veclen;
  vector_t ****var;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint32 *local_40;
  vector_t ****local_38;
  
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/printp/main.c"
          ,0xd0,"Reading %s\n",fn);
  iVar1 = s3gau_read_full(fn,&local_38,&local_44,&local_48,&local_4c,&local_40);
  iVar2 = -1;
  if (iVar1 == 0) {
    printf("param %u %u %u (full)\n",(ulong)local_44,(ulong)local_48);
    if (local_44 != 0) {
      uVar4 = 0;
      do {
        printf("mgau %u\n",uVar4 & 0xffffffff);
        if (local_48 != 0) {
          uVar3 = 0;
          do {
            printf("feat %u\n",uVar3 & 0xffffffff);
            if (local_4c != 0) {
              uVar6 = 0;
              do {
                printf("density %4u (%ux%u)\n",uVar6 & 0xffffffff,(ulong)local_40[uVar3]);
                if (local_40[uVar3] != 0) {
                  uVar7 = 0;
                  do {
                    if (local_40[uVar3] != 0) {
                      uVar5 = 0;
                      do {
                        printf(e_fmt,(double)local_38[uVar4][uVar3][uVar6][uVar7][uVar5]);
                        uVar5 = uVar5 + 1;
                      } while (uVar5 < local_40[uVar3]);
                    }
                    putchar(10);
                    uVar7 = uVar7 + 1;
                  } while (uVar7 < local_40[uVar3]);
                }
                uVar6 = uVar6 + 1;
              } while (uVar6 < local_4c);
            }
            uVar3 = uVar3 + 1;
          } while (uVar3 < local_48);
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 < local_44);
    }
    ckd_free(local_40);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int
print_full_gau(const char *fn)
{
    vector_t ****var;
    uint32 n_mgau;
    uint32 n_feat;
    uint32 *veclen;
    uint32 n_density;
    uint32 i, j, k, l, m;

    E_INFO("Reading %s\n",  fn);
    
    if (s3gau_read_full(fn,
			&var,
			&n_mgau,
			&n_feat,
			&n_density,
			&veclen) != S3_SUCCESS)
	return S3_ERROR;

    printf("param %u %u %u (full)\n", n_mgau, n_feat, n_density);

    for (i = 0; i < n_mgau; i++) {
	printf("mgau %u\n", i);
	for (j = 0; j < n_feat; j++) {
	    printf("feat %u\n", j);
	    for (k = 0; k < n_density; k++) {
		printf("density %4u (%ux%u)\n", k, veclen[j], veclen[j]);
		for (l = 0; l < veclen[j]; l++) {
		    for (m = 0; m < veclen[j]; m++) {
			printf(e_fmt, var[i][j][k][l][m]);
		    }
		printf("\n");
		}
	    }
	}
    }
    ckd_free(veclen);
    return S3_SUCCESS;
}